

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

int SHA512_Update(SHA512_CTX *c,void *data,size_t len)

{
  int in_EAX;
  uint uVar1;
  ulong uVar2;
  ulong extraout_RAX;
  SHA512_CTX *pSVar3;
  uint usedspace;
  uint freespace;
  size_t len_local;
  sha2_byte *data_local;
  SHA512_CTX *context_local;
  
  if (len != 0) {
    if ((c == (SHA512_CTX *)0x0) || (data == (void *)0x0)) {
      __assert_fail("context != (SHA512_CTX*)0 && data != (sha2_byte*)0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c"
                    ,0x349,"void SHA512_Update(SHA512_CTX *, const sha2_byte *, size_t)");
    }
    uVar2 = c->Nl >> 3 & 0x7f;
    _usedspace = len;
    len_local = (size_t)data;
    if ((int)uVar2 != 0) {
      uVar1 = 0x80 - (int)uVar2;
      if (len < uVar1) {
        memcpy((void *)((long)c->h + uVar2 + 0x50),data,len);
        c->Nl = len * 8 + c->Nl;
        pSVar3 = (SHA512_CTX *)c->Nl;
        if ((SHA512_CTX *)c->Nl < (SHA512_CTX *)(len << 3)) {
          c->Nh = c->Nh + 1;
          pSVar3 = c;
        }
        return (int)pSVar3;
      }
      memcpy((void *)((long)c->h + uVar2 + 0x50),data,(ulong)uVar1);
      c->Nl = (ulong)(uVar1 * 8) + c->Nl;
      if (c->Nl < (ulong)(uVar1 * 8)) {
        c->Nh = c->Nh + 1;
      }
      _usedspace = len - uVar1;
      len_local = (long)data + (ulong)uVar1;
      SHA512_Transform((SHA512_CTX *)c,(c->u).d);
      uVar2 = extraout_RAX;
    }
    for (; in_EAX = (int)uVar2, 0x7f < _usedspace; _usedspace = _usedspace - 0x80) {
      SHA512_Transform((SHA512_CTX *)c,(sha2_word64 *)len_local);
      c->Nl = c->Nl + 0x400;
      if (c->Nl < 0x400) {
        c->Nh = c->Nh + 1;
      }
      uVar2 = len_local + 0x80;
      len_local = uVar2;
    }
    if (_usedspace != 0) {
      memcpy(&c->u,(void *)len_local,_usedspace);
      c->Nl = _usedspace * 8 + c->Nl;
      pSVar3 = (SHA512_CTX *)c->Nl;
      if ((SHA512_CTX *)c->Nl < (SHA512_CTX *)(_usedspace << 3)) {
        c->Nh = c->Nh + 1;
        pSVar3 = c;
      }
      in_EAX = (int)pSVar3;
    }
  }
  return in_EAX;
}

Assistant:

void SHA512_Update(SHA512_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	/* Sanity check: */
	assert(context != (SHA512_CTX*)0 && data != (sha2_byte*)0);

	usedspace = (context->bitcount[0] >> 3) % SHA512_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA512_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(&context->buffer[usedspace], data, freespace);
			ADDINC128(context->bitcount, freespace << 3);
			len -= freespace;
			data += freespace;
			SHA512_Transform(context, (sha2_word64*)context->buffer);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(&context->buffer[usedspace], data, len);
			ADDINC128(context->bitcount, len << 3);
			return;
		}
	}
	while (len >= SHA512_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		SHA512_Transform(context, (sha2_word64*)data);
		ADDINC128(context->bitcount, SHA512_BLOCK_LENGTH << 3);
		len -= SHA512_BLOCK_LENGTH;
		data += SHA512_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		ADDINC128(context->bitcount, len << 3);
	}
}